

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseInt(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  Bool BVar1;
  uint local_34;
  tchar c;
  TidyConfigImpl *cfg;
  ulong uStack_20;
  Bool digits;
  ulong number;
  TidyOptionImpl *entry_local;
  TidyDocImpl *doc_local;
  
  uStack_20 = 0;
  cfg._4_4_ = no;
  local_34 = SkipWhite(&doc->config);
  while( true ) {
    BVar1 = prvTidyIsDigit(local_34);
    if (BVar1 == no) break;
    uStack_20 = (ulong)(local_34 - 0x30) + uStack_20 * 10;
    cfg._4_4_ = yes;
    local_34 = AdvanceChar(&doc->config);
  }
  if (cfg._4_4_ == no) {
    prvTidyReportBadArgument(doc,entry->name);
  }
  else {
    prvTidySetOptionInt(doc,entry->id,uStack_20);
  }
  return cfg._4_4_;
}

Assistant:

Bool ParseInt( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    ulong number = 0;
    Bool digits = no;
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );

    while ( TY_(IsDigit)(c) )
    {
        number = c - '0' + (10 * number);
        digits = yes;
        c = AdvanceChar( cfg );
    }

    if ( !digits )
        TY_(ReportBadArgument)( doc, entry->name );
    else
        TY_(SetOptionInt)( doc, entry->id, number );
    return digits;
}